

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O2

int __thiscall asmjit::CallConv::init(CallConv *this,EVP_PKEY_CTX *ctx)

{
  undefined1 auVar1 [64];
  Error EVar2;
  undefined1 auVar3 [32];
  
  this->_preservedRegs[2] = 0;
  this->_preservedRegs[3] = 0;
  auVar1 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  this->_id = auVar1[0];
  this->_archType = auVar1[1];
  this->_algorithm = auVar1[2];
  this->_flags = auVar1[3];
  this->_naturalStackAlignment = auVar1[4];
  this->_spillZoneSize = auVar1[5];
  this->_redZoneSize = auVar1._6_2_;
  this->_passedOrder[0] = (RegOrder)auVar1._8_8_;
  this->_passedOrder[1] = (RegOrder)auVar1._16_8_;
  this->_passedOrder[2] = (RegOrder)auVar1._24_8_;
  this->_passedOrder[3] = (RegOrder)auVar1._32_8_;
  this->_passedRegs[0] = auVar1._40_4_;
  this->_passedRegs[1] = auVar1._44_4_;
  this->_passedRegs[2] = auVar1._48_4_;
  this->_passedRegs[3] = auVar1._52_4_;
  this->_preservedRegs[0] = auVar1._56_4_;
  this->_preservedRegs[1] = auVar1._60_4_;
  auVar3 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  auVar3 = vpcmpeqd_avx2(auVar3,auVar3);
  *(undefined1 (*) [32])this->_passedOrder = auVar3;
  if ((uint32_t)ctx - 0x10 < 0x20) {
    EVar2 = X86Internal::initCallConv(this,(uint32_t)ctx);
    return EVar2;
  }
  return 3;
}

Assistant:

ASMJIT_INLINE void reset() noexcept {
    ::memset(this, 0, sizeof(*this));
    ::memset(_passedOrder, 0xFF, sizeof(_passedOrder));
  }